

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerMessageDeflate.h
# Opt level: O2

void __thiscall uWS::DeflationStream::DeflationStream(DeflationStream *this,int compressOptions)

{
  undefined8 uVar1;
  undefined8 uStack_8;
  
  (this->deflationStream).next_in = (Bytef *)0x0;
  (this->deflationStream).avail_in = 0;
  (this->deflationStream).total_in = 0;
  (this->deflationStream).next_out = (Bytef *)0x0;
  (this->deflationStream).avail_out = 0;
  (this->deflationStream).total_out = 0;
  (this->deflationStream).msg = (char *)0x0;
  (this->deflationStream).state = (internal_state *)0x0;
  (this->deflationStream).zalloc = (alloc_func)0x0;
  (this->deflationStream).data_type = 0;
  (this->deflationStream).zfree = (free_func)0x0;
  (this->deflationStream).opaque = (voidpf)0x0;
  (this->deflationStream).adler = 0;
  (this->deflationStream).reserved = 0;
  uVar1 = 0xfffffffffffffff7;
  if (compressOptions == 6) {
    uStack_8 = 1;
    goto LAB_00168990;
  }
  if (compressOptions != 0x202) {
    if (compressOptions == 0x12) {
      uStack_8 = 0xfffffffffffffff6;
      uVar1 = uStack_8;
      uStack_8 = 3;
      goto LAB_00168990;
    }
    if (compressOptions == 0x22) {
      uStack_8 = 0xfffffffffffffff5;
      uVar1 = uStack_8;
      uStack_8 = 4;
      goto LAB_00168990;
    }
    if (compressOptions == 0x42) {
      uStack_8 = 0xfffffffffffffff4;
      uVar1 = uStack_8;
      uStack_8 = 5;
      goto LAB_00168990;
    }
    if (compressOptions == 0x82) {
      uStack_8 = 0xfffffffffffffff3;
      uVar1 = uStack_8;
      uStack_8 = 6;
      goto LAB_00168990;
    }
    if (compressOptions == 0x102) {
      uStack_8 = 0xfffffffffffffff2;
      uVar1 = uStack_8;
      uStack_8 = 7;
      goto LAB_00168990;
    }
    if (compressOptions == 10) {
      uStack_8 = 2;
      goto LAB_00168990;
    }
  }
  uStack_8 = 0xfffffffffffffff1;
  uVar1 = uStack_8;
  uStack_8 = 8;
LAB_00168990:
  deflateInit2_(this,1,8,uVar1,uStack_8,0,"1.2.11",0x70);
  return;
}

Assistant:

DeflationStream(int compressOptions) {

        /* Sliding inflator should be about 44kb by default, less than compressor */

        /* Memory usage is given by 2 ^ (windowBits + 2) + 2 ^ (memLevel + 9) */
        int windowBits = -15, memLevel = 8;

        if (compressOptions == DEDICATED_COMPRESSOR_3KB) {
            windowBits = -9;
            memLevel = 1;
        } else if (compressOptions == DEDICATED_COMPRESSOR_4KB) {
            windowBits = -9;
            memLevel = 2;
        } else if (compressOptions == DEDICATED_COMPRESSOR_8KB) {
            windowBits = -10;
            memLevel = 3;
        } else if (compressOptions == DEDICATED_COMPRESSOR_16KB) {
            windowBits = -11;
            memLevel = 4;
        } else if (compressOptions == DEDICATED_COMPRESSOR_32KB) {
            windowBits = -12;
            memLevel = 5;
        } else if (compressOptions == DEDICATED_COMPRESSOR_64KB) {
            windowBits = -13;
            memLevel = 6;
        } else if (compressOptions == DEDICATED_COMPRESSOR_128KB) {
            windowBits = -14;
            memLevel = 7;
        } else if (compressOptions == DEDICATED_COMPRESSOR_256KB) {
            windowBits = -15;
            memLevel = 8;
        }

        /* DEDICATED_COMPRESSOR_256KB is the same as DEDICATED_COMPRESSOR */

        deflateInit2(&deflationStream, 1, Z_DEFLATED, windowBits, memLevel, Z_DEFAULT_STRATEGY);
    }